

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O0

void __thiscall
yactfr::internal::JsonStructMemberTypeValReq::JsonStructMemberTypeValReq
          (JsonStructMemberTypeValReq *this,JsonAnyFullDtValReq *anyFullDtValReq)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>
  __l;
  bool in_DL;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  *local_1b0;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>
  local_17d;
  key_equal local_17c;
  hasher local_17b;
  undefined1 local_17a;
  allocator local_179;
  string local_178;
  PropReqsEntry *local_148;
  PropReqsEntry local_140;
  PropReqsEntry local_108;
  undefined1 local_d0 [56];
  undefined1 local_98 [56];
  iterator local_60;
  size_type local_58;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>_>
  local_50;
  JsonAnyFullDtValReq *local_18;
  JsonAnyFullDtValReq *anyFullDtValReq_local;
  JsonStructMemberTypeValReq *this_local;
  
  local_17a = 1;
  local_148 = &local_140;
  local_18 = anyFullDtValReq;
  anyFullDtValReq_local = (JsonAnyFullDtValReq *)this;
  (anonymous_namespace)::namePropReqEntry_abi_cxx11_(local_148,(_anonymous_namespace_ *)0x1,in_DL);
  local_148 = &local_108;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"field-class",&local_179);
  anon_unknown_0::anyDtPropReqEntry(&local_108,&local_178,local_18,true);
  local_148 = (PropReqsEntry *)local_d0;
  (anonymous_namespace)::attrsPropReqEntry_abi_cxx11_();
  local_148 = (PropReqsEntry *)local_98;
  (anonymous_namespace)::extPropReqEntry_abi_cxx11_();
  local_17a = 0;
  local_60 = &local_140;
  local_58 = 4;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>
  ::allocator(&local_17d);
  __l._M_len = local_58;
  __l._M_array = local_60;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>_>
  ::unordered_map(&local_50,__l,0,&local_17b,&local_17c,&local_17d);
  JsonObjValReq::JsonObjValReq(&this->super_JsonObjValReq,&local_50,false);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>_>
  ::~unordered_map(&local_50);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>
  ::~allocator(&local_17d);
  local_1b0 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
               *)&local_60;
  do {
    local_1b0 = local_1b0 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
    ::~pair(local_1b0);
  } while (local_1b0 != &local_140);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  (this->super_JsonObjValReq).super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonStructMemberTypeValReq_007dfdf0;
  return;
}

Assistant:

explicit JsonStructMemberTypeValReq(const JsonAnyFullDtValReq& anyFullDtValReq) :
        JsonObjValReq {{
            namePropReqEntry(true),
            anyDtPropReqEntry(strs::fc, anyFullDtValReq, true),
            attrsPropReqEntry(),
            extPropReqEntry(),
        }}
    {
    }